

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromHexadecimalString
          (IEEEFloat *this,StringRef s,roundingMode rounding_mode)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  opStatus oVar4;
  byte *pbVar5;
  int iVar6;
  uint uVar7;
  lostFraction lost_fraction;
  ulong uVar8;
  byte *pbVar9;
  uint uVar10;
  short sVar11;
  bool bVar12;
  int iVar13;
  Significand *dst;
  int iVar14;
  byte *pbVar15;
  uint uVar16;
  Significand *pSVar17;
  byte *end;
  bool bVar18;
  iterator dot;
  byte *local_48;
  roundingMode local_3c;
  byte *local_38;
  
  local_38 = (byte *)s.Data;
  this->field_0x12 = this->field_0x12 & 0xf8 | 2;
  uVar16 = this->semantics->precision;
  pSVar17 = &this->significand;
  dst = pSVar17;
  if (uVar16 - 0x40 < 0xffffff80) {
    dst = (Significand *)(this->significand).parts;
  }
  lost_fraction = lfExactlyZero;
  local_3c = rounding_mode;
  APInt::tcSet(&dst->part,0,uVar16 + 0x40 >> 6);
  this->exponent = 0;
  uVar16 = this->semantics->precision;
  if (uVar16 - 0x40 < 0xffffff80) {
    pSVar17 = (Significand *)(this->significand).parts;
  }
  uVar16 = uVar16 & 0xffffffc0;
  uVar10 = uVar16 + 0x40;
  end = local_38 + s.Length;
  pbVar5 = (byte *)skipLeadingZeroesAndAnyDot
                             ((iterator)local_38,(iterator)end,(iterator *)&local_48);
  bVar12 = false;
  pbVar15 = pbVar5;
  pbVar9 = local_48;
  do {
    if (pbVar15 == end) break;
    bVar1 = *pbVar15;
    iVar6 = (int)(char)bVar1;
    if (iVar6 == 0x2e) {
      bVar18 = pbVar9 != end;
      pbVar9 = pbVar15;
      pbVar3 = pbVar15;
      if (bVar18) {
        __assert_fail("dot == end && \"String contains multiple dots\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x8f6,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                     );
      }
LAB_00191fbb:
      local_48 = pbVar3;
      pbVar15 = pbVar15 + 1;
      bVar18 = false;
    }
    else {
      if ((byte)(bVar1 - 0x30) < 10) {
        uVar8 = (ulong)(iVar6 - 0x30);
      }
      else if ((byte)(bVar1 + 0x9f) < 6) {
        uVar8 = (ulong)(iVar6 - 0x57);
      }
      else {
        uVar8 = (ulong)(iVar6 - 0x37);
        if (5 < (byte)(bVar1 + 0xbf)) {
          uVar8 = 0xffffffff;
        }
      }
      uVar7 = (uint)uVar8;
      if (uVar7 != 0xffffffff) {
        pbVar3 = local_48;
        if (uVar10 == 0) {
          uVar10 = 0;
          if (!bVar12) {
            bVar12 = true;
            if (uVar7 < 9) {
              pbVar2 = pbVar15;
              if ((uVar8 & 7) == 0) {
                do {
                  pbVar2 = pbVar2 + 1;
                  if (pbVar2 == end) {
                    __assert_fail("p != end && \"Invalid trailing hexadecimal fraction!\"",
                                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                                  ,0x194,
                                  "lostFraction llvm::trailingHexadecimalFraction(StringRef::iterator, StringRef::iterator, unsigned int)"
                                 );
                  }
                  bVar1 = *pbVar2;
                } while ((bVar1 == 0x30) || (bVar1 == 0x2e));
                iVar6 = (int)(char)bVar1;
                if ((byte)(bVar1 - 0x30) < 10) {
                  iVar6 = iVar6 + -0x30;
                }
                else if ((byte)(bVar1 + 0x9f) < 6) {
                  iVar6 = iVar6 + -0x57;
                }
                else {
                  iVar6 = iVar6 + -0x37;
                  if (5 < (byte)(bVar1 + 0xbf)) {
                    iVar6 = -1;
                  }
                }
                if (iVar6 == -1) {
                  lost_fraction = (uint)(uVar7 != 0) * 2;
                }
                else {
                  lost_fraction = (uint)(uVar7 != 0) * 2 + lfLessThanHalf;
                }
              }
              else {
                lost_fraction = lfLessThanHalf;
              }
            }
            else {
              lost_fraction = lfMoreThanHalf;
            }
            uVar10 = 0;
          }
        }
        else {
          uVar10 = uVar10 - 4;
          pSVar17[uVar10 >> 6].part = pSVar17[uVar10 >> 6].part | uVar8 << ((byte)uVar10 & 0x3f);
        }
        goto LAB_00191fbb;
      }
      bVar18 = true;
    }
  } while (!bVar18);
  if (pbVar15 == end) {
    __assert_fail("p != end && \"Hex strings require an exponent\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x90d,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                 );
  }
  if ((*pbVar15 | 0x20) != 0x70) {
    __assert_fail("(*p == \'p\' || *p == \'P\') && \"Invalid character in significand\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x90e,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                 );
  }
  if (pbVar15 == local_38) {
    __assert_fail("p != begin && \"Significand has no digits\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x90f,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                 );
  }
  if ((long)pbVar15 - (long)local_38 == 1 && local_48 != end) {
    __assert_fail("(dot == end || p - begin != 1) && \"Significand has no digits\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x910,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                 );
  }
  if (pbVar15 != pbVar5) {
    if (local_48 == end) {
      local_48 = pbVar15;
    }
    pbVar9 = pbVar15 + 1;
    if (pbVar9 == end) {
      __assert_fail("p != end && \"Exponent has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xf6,"int llvm::totalExponent(StringRef::iterator, StringRef::iterator, int)");
    }
    bVar1 = *pbVar9;
    if (((bVar1 == 0x2d) || (bVar1 == 0x2b)) && (pbVar9 = pbVar15 + 2, pbVar9 == end)) {
      __assert_fail("p != end && \"Exponent has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xfb,"int llvm::totalExponent(StringRef::iterator, StringRef::iterator, int)");
    }
    iVar6 = 0;
    if (pbVar9 == end) {
      iVar14 = 0;
      bVar12 = false;
    }
    else {
      iVar14 = 0;
      do {
        pbVar15 = pbVar9 + 1;
        if (9 < (int)(char)*pbVar9 - 0x30U) {
          __assert_fail("value < 10U && \"Invalid character in exponent\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0x104,
                        "int llvm::totalExponent(StringRef::iterator, StringRef::iterator, int)");
        }
        iVar14 = ((int)(char)*pbVar9 - 0x30U) + iVar14 * 10;
        bVar12 = false;
        if (0x7fff < iVar14) {
          bVar12 = true;
          break;
        }
        pbVar9 = pbVar15;
      } while (pbVar15 != end);
    }
    iVar13 = (int)local_48 - (int)pbVar5;
    iVar13 = (this->semantics->precision - uVar16) + (iVar13 - (iVar13 >> 0x1f)) * 4 + -0x41;
    if ((short)iVar13 != iVar13) {
      bVar12 = true;
    }
    if (!bVar12) {
      iVar6 = -iVar14;
      if (bVar1 != 0x2d) {
        iVar6 = iVar14;
      }
      iVar6 = iVar6 + iVar13;
      if ((short)iVar6 != iVar6) {
        bVar12 = true;
      }
    }
    sVar11 = (bVar1 == 0x2d) + 0x7fff;
    if (!bVar12) {
      sVar11 = (short)iVar6;
    }
    this->exponent = sVar11;
  }
  oVar4 = normalize(this,local_3c,lost_fraction);
  return oVar4;
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::convertFromHexadecimalString(StringRef s,
                                        roundingMode rounding_mode) {
  lostFraction lost_fraction = lfExactlyZero;

  category = fcNormal;
  zeroSignificand();
  exponent = 0;

  integerPart *significand = significandParts();
  unsigned partsCount = partCount();
  unsigned bitPos = partsCount * integerPartWidth;
  bool computedTrailingFraction = false;

  // Skip leading zeroes and any (hexa)decimal point.
  StringRef::iterator begin = s.begin();
  StringRef::iterator end = s.end();
  StringRef::iterator dot;
  StringRef::iterator p = skipLeadingZeroesAndAnyDot(begin, end, &dot);
  StringRef::iterator firstSignificantDigit = p;

  while (p != end) {
    integerPart hex_value;

    if (*p == '.') {
      assert(dot == end && "String contains multiple dots");
      dot = p++;
      continue;
    }

    hex_value = hexDigitValue(*p);
    if (hex_value == -1U)
      break;

    p++;

    // Store the number while we have space.
    if (bitPos) {
      bitPos -= 4;
      hex_value <<= bitPos % integerPartWidth;
      significand[bitPos / integerPartWidth] |= hex_value;
    } else if (!computedTrailingFraction) {
      lost_fraction = trailingHexadecimalFraction(p, end, hex_value);
      computedTrailingFraction = true;
    }
  }

  /* Hex floats require an exponent but not a hexadecimal point.  */
  assert(p != end && "Hex strings require an exponent");
  assert((*p == 'p' || *p == 'P') && "Invalid character in significand");
  assert(p != begin && "Significand has no digits");
  assert((dot == end || p - begin != 1) && "Significand has no digits");

  /* Ignore the exponent if we are zero.  */
  if (p != firstSignificantDigit) {
    int expAdjustment;

    /* Implicit hexadecimal point?  */
    if (dot == end)
      dot = p;

    /* Calculate the exponent adjustment implicit in the number of
       significant digits.  */
    expAdjustment = static_cast<int>(dot - firstSignificantDigit);
    if (expAdjustment < 0)
      expAdjustment++;
    expAdjustment = expAdjustment * 4 - 1;

    /* Adjust for writing the significand starting at the most
       significant nibble.  */
    expAdjustment += semantics->precision;
    expAdjustment -= partsCount * integerPartWidth;

    /* Adjust for the given exponent.  */
    exponent = totalExponent(p + 1, end, expAdjustment);
  }

  return normalize(rounding_mode, lost_fraction);
}